

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

char * decode_decimal(char *str,unsigned_long *v)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  char *orig;
  ulong uVar4;
  
  lVar1 = 0;
  uVar3 = 0;
  while( true ) {
    if ((byte)(str[lVar1] - 0x3aU) < 0xf6) {
      if ((lVar1 != 0) && ((lVar1 == 1 || (*str != '0')))) {
        *v = uVar3;
        return str + lVar1;
      }
      return (char *)0x0;
    }
    if (0x1999999999999999 < uVar3) {
      return (char *)0x0;
    }
    uVar4 = uVar3 * 10;
    uVar2 = (ulong)(byte)(str[lVar1] - 0x30);
    uVar3 = uVar2 + uVar4;
    if (CARRY8(uVar2,uVar4)) break;
    lVar1 = lVar1 + 1;
  }
  return (char *)0x0;
}

Assistant:

static const char *decode_decimal(const char *str, unsigned long *v) {
    const char *orig;
    unsigned long acc;

    acc = 0;
    for (orig = str;; str++) {
        int c;

        c = *str;
        if (c < '0' || c > '9') {
            break;
        }
        c -= '0';
        if (acc > (ULONG_MAX / 10)) {
            return NULL;
        }
        acc *= 10;
        if ((unsigned long)c > (ULONG_MAX - acc)) {
            return NULL;
        }
        acc += (unsigned long)c;
    }
    if (str == orig || (*orig == '0' && str != (orig + 1))) {
        return NULL;
    }
    *v = acc;
    return str;
}